

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::IntLiteral::IntLiteral(IntLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  VariableType *type;
  int ndx;
  long lVar4;
  int max;
  ConstStridedValueAccess<1> CVar5;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  int local_50;
  VariableType *local_48;
  pointer pMStack_40;
  pointer local_38;
  pointer pMStack_30;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__IntLiteral_00190f58;
  type = VariableType::getScalarType(TYPE_INT);
  ValueStorage<64>::ValueStorage(&this->m_value,type);
  local_78._8_8_ = &local_60;
  local_78._0_8_ = (VariableType *)0x2;
  local_78._16_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = 1;
  local_48 = (VariableType *)0x0;
  pMStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pMStack_30 = (pointer)0x0;
  bVar2 = VariableType::operator==(valueRange.m_type,(VariableType *)local_78);
  VariableType::~VariableType((VariableType *)local_78);
  if (bVar2) {
    local_78._0_8_ = valueRange.m_type;
    local_78._8_8_ = valueRange.m_min;
    CVar5 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)local_78,0);
    iVar3 = (CVar5.m_value)->intVal;
    local_78._0_8_ = valueRange.m_type;
    local_78._8_8_ = valueRange.m_max;
    CVar5 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)local_78,0);
    max = 0x10;
    if ((CVar5.m_value)->intVal != 0x7fffffff) {
      max = (CVar5.m_value)->intVal;
    }
  }
  else {
    iVar3 = -0x10;
    max = 0x10;
  }
  iVar3 = de::Random::getInt(state->m_random,iVar3,max);
  VariableType::getScalarType(TYPE_INT);
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    pSVar1[lVar4].intVal = iVar3;
  }
  return;
}

Assistant:

IntLiteral::IntLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_INT))
{
	int minVal = -16;
	int maxVal = +16;

	if (valueRange.getType() == VariableType(VariableType::TYPE_INT, 1))
	{
		minVal = valueRange.getMin().component(0).asInt();
		maxVal = valueRange.getMax().component(0).asInt();

		if (Scalar::min<int>() == minVal)
			minVal = -16;

		if (Scalar::max<int>() == maxVal)
			maxVal = 16;
	}

	int				value	= state.getRandom().getInt(minVal, maxVal);
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_INT));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asInt(ndx) = value;
}